

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  BaseEmitter *pBVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Error EVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  TypeId *pTVar13;
  ulong uVar14;
  int iVar15;
  undefined7 in_register_00000009;
  uint *puVar16;
  ulong extraout_RDX;
  ulong uVar17;
  InstId IVar18;
  EmitHelper *this_00;
  InstId IVar19;
  char *in_R9;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  byte bVar23;
  bool bVar24;
  Operand_ OStack_80;
  Operand_ OStack_70;
  Operand dst;
  Operand src;
  
  puVar16 = (uint *)CONCAT71(in_register_00000009,typeId);
  if (((byte)(typeId + ~_kVec512End) < 0xbb) || ((typeId & 0x7e) == _kBaseStart)) {
    emitRegMove();
    bVar23 = (byte)comment;
    uVar14 = extraout_RDX;
    this_00 = this;
    if ((int)extraout_RDX == 0) {
      OStack_70._signature._bits._0_1_ = (byte)(dst_->_signature)._bits >> 3;
      this_00 = (EmitHelper *)
                (_archTraits +
                (ulong)(((this->super_BaseEmitHelper)._emitter)->_environment)._arch * 0xd8 + 0x94);
      pTVar13 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                          ((Array<asmjit::v1_14::TypeId,_32UL> *)this_00,(RegType *)&OStack_70);
      uVar14 = (ulong)*pTVar13;
    }
    iVar10 = (int)this_00;
    bVar5 = (byte)uVar14;
    if (((byte)(bVar5 + 0x9b) < 0xbb) || ((bVar5 & 0x7e) == 0x20)) {
      emitArgMove();
LAB_00141b32:
      emitArgMove();
      EVar9 = 0;
      if (iVar10 - 1U < 8) {
        EVar9 = *(Error *)(&DAT_00155f20 + (ulong)(iVar10 - 1U) * 4);
      }
      return EVar9;
    }
    if (((byte)(bVar23 + 0x9b) < 0xbb) || ((bVar23 & 0x7e) == 0x20)) goto LAB_00141b32;
    uVar14 = uVar14 & 0xff;
    uVar17 = (ulong)comment & 0xff;
    OStack_70._signature._bits = (dst_->_signature)._bits;
    OStack_70._baseId = dst_->_baseId;
    OStack_70._data = *&dst_->_data;
    uVar8._0_4_ = puVar16[0];
    uVar8._4_4_ = puVar16[1];
    OStack_80._data = *(uint32_t (*) [2])(puVar16 + 2);
    bVar2 = TypeUtils::_typeData[uVar14 + 0x100];
    bVar3 = TypeUtils::_typeData[uVar17 + 0x100];
    uVar20 = (uint)bVar3;
    uVar22 = (uint)bVar3;
    uVar11 = (uint)bVar3;
    uVar21 = (uint)bVar2;
    OStack_80._0_8_ = uVar8;
    if ((byte)(bVar5 - 0x20) < 10) {
      if ((byte)(bVar23 - 0x20) < 10) {
        iVar10 = (int)uVar14 * 0x100;
        iVar15 = iVar10 + (int)uVar17;
        uVar11 = (iVar10 + (int)uVar17) - 0x2822;
        if ((((uVar11 < 5) && ((0x15U >> (uVar11 & 0x1f) & 1) != 0)) || (iVar15 == 0x2422)) ||
           ((iVar15 == 0x2624 || (iVar15 == 0x2622)))) {
          IVar18 = iVar15 == 0x2826 | 0x1da;
          OStack_70._signature._bits = *(uint32_t *)(regSizeToGpSignature + (ulong)bVar2 * 4);
          if ((uVar8._0_4_ & 7) == 1) {
            OStack_80._baseId = uVar8._4_4_;
            OStack_80._signature._bits = *(uint32_t *)(regSizeToGpSignature + (ulong)bVar3 * 4);
          }
          goto LAB_00141920;
        }
      }
      else if ((*puVar16 & 7) != 2) {
        uVar22 = uVar20;
        if (uVar21 < uVar11) {
          uVar22 = (uint)bVar2;
        }
        if ((byte)(bVar23 - 0x31) < 2) {
          if (uVar22 != 8) {
            OStack_70._signature._bits = 0x4000031;
            IVar18 = 0x1bc;
            goto LAB_00141920;
          }
LAB_001417f8:
          IVar18 = 0x1d3;
        }
        else {
          if ((byte)(bVar23 - 0x2d) < 4) {
            IVar18 = kmovInstFromSize(uVar22);
            uVar6._0_4_ = 0x8000039;
            if (uVar22 < 5) {
              uVar6._0_4_ = 0x4000031;
            }
            OStack_70._signature._bits = uVar6._0_4_;
            goto LAB_00141920;
          }
          if (0x31 < (byte)(bVar23 - 0x33)) {
            return 3;
          }
          IVar18 = 0x1d3;
          if (this->_avxEnabled != false) {
            IVar18 = 0x4c0;
          }
          if (uVar22 != 8) {
            IVar18 = 0x1bc;
            if (this->_avxEnabled != false) {
              IVar18 = 0x4aa;
            }
            OStack_70._signature._bits = 0x4000031;
            goto LAB_00141920;
          }
        }
LAB_001417fd:
        uVar22 = 8;
        goto LAB_00141920;
      }
      bVar23 = bVar2;
      if (bVar3 <= bVar2) {
        bVar23 = bVar3;
      }
      IVar18 = 0x1b7;
      if (bVar23 < 4) {
        IVar18 = 0x1de;
      }
      uVar14 = (ulong)bVar23;
      if (bVar3 <= bVar2) {
        uVar14 = (ulong)bVar3;
      }
      uVar17 = 4;
      if (4 < bVar23) {
        uVar17 = (ulong)bVar2;
      }
      OStack_70._signature._bits = *(uint32_t *)(regSizeToGpSignature + uVar17 * 4);
      if ((uVar8._0_4_ & 7) == 1) {
        OStack_80._baseId = uVar8._4_4_;
        OStack_80._signature._bits = *(uint32_t *)(regSizeToGpSignature + uVar14 * 4);
      }
      uVar22 = (uint)uVar14;
    }
    else {
      if ((byte)(bVar5 - 0x31) < 2) {
        uVar22 = (uint)bVar2;
        if ((uint)bVar3 < (uint)bVar2) {
          uVar22 = (uint)bVar3;
        }
        if ((9 < (byte)(bVar23 - 0x20)) && ((uVar8._0_4_ & 7) != 2)) {
          IVar18 = 0x1d3;
          if ((1 < (byte)(bVar23 - 0x31)) && (IVar18 = 0x1c0, 0x31 < (byte)(bVar23 - 0x33))) {
            return 3;
          }
          goto LAB_00141920;
        }
        if (uVar22 == 8) goto LAB_001417f8;
        uVar11 = uVar8._0_4_ & 7;
        IVar18 = 0x1bc;
joined_r0x00141a7d:
        if (uVar11 != 1) goto LAB_00141920;
      }
      else {
        if (3 < (byte)(bVar5 - 0x2d)) {
          if (0x31 < (byte)(bVar5 - 0x33)) {
            return 3;
          }
          OStack_70._signature._bits = 0x10000161;
          IVar18 = 0x1d4;
          if ((uVar8._0_4_ & 0xff000fff) == 0x8000391) goto LAB_00141920;
          if (TypeUtils::_typeData[uVar17] == '+' && TypeUtils::_typeData[uVar14] == '*') {
            uVar22 = uVar21 * 2;
            if (uVar11 < uVar21 * 2) {
              uVar22 = uVar20;
            }
            bVar24 = (this->_avxEnabled & 1U) != 0;
            IVar19 = 0x9b;
            if (bVar24) {
              IVar19 = 0x3a4;
            }
            IVar18 = 0x95;
            if (bVar24) {
              IVar18 = 0x390;
            }
            if (uVar22 < 9) {
              IVar18 = IVar19;
            }
            if ((uVar22 & 0xfe) == 0x40) {
              OStack_70._signature._bits = 0x20000169;
            }
            if ((uVar8._0_4_ & 7) != 1) goto LAB_00141920;
            uVar12 = 0x40000171;
            if (uVar22 < 0x21) {
              uVar12 = 0x20000169;
            }
            uVar6._0_4_ = 0x10000161;
            if (0x10 < uVar22) {
              uVar6._0_4_ = uVar12;
            }
          }
          else {
            if (TypeUtils::_typeData[uVar17] == '*' && TypeUtils::_typeData[uVar14] == '+') {
              uVar11 = uVar11 * 2;
              if (uVar21 <= uVar11) {
                uVar11 = (uint)bVar2;
              }
              uVar22 = uVar11 >> 1;
              bVar24 = (this->_avxEnabled & 1U) != 0;
              IVar19 = 0x98;
              if (bVar24) {
                IVar19 = 0x39b;
              }
              IVar18 = 0x91;
              if (bVar24) {
                IVar18 = 0x382;
              }
              if (uVar11 < 10) {
                IVar18 = IVar19;
              }
              uVar12 = 0x40000171;
              if ((uVar11 & 0xfe) < 0x21) {
                uVar12 = 0x20000169;
              }
              OStack_70._signature._bits = 0x10000161;
              if (0x10 < (uVar11 & 0xfe)) {
                OStack_70._signature._bits = uVar12;
              }
              if (((uVar8._0_4_ & 7) == 1) && (0x3f < uVar11)) {
                OStack_80._baseId = uVar8._4_4_;
                OStack_80._signature._bits = 0x20000169;
              }
              goto LAB_00141920;
            }
            if (uVar11 < uVar21) {
              bVar2 = bVar3;
            }
            uVar22 = (uint)bVar2;
            uVar11 = uVar8._0_4_ & 7;
            if ((uVar8._0_4_ & 0xf07) == 1 || uVar11 == 2) {
              if (uVar22 < 5) {
                IVar18 = 0x1bc;
                if (this->_avxEnabled != false) {
                  IVar18 = 0x4aa;
                }
                uVar11 = uVar8._0_4_ & 3;
                goto joined_r0x00141a7d;
              }
              if (uVar22 == 8) {
                IVar18 = 0x1d3;
                if (this->_avxEnabled != false) {
                  IVar18 = 0x4c0;
                }
                goto LAB_001417fd;
              }
            }
            if ((uVar8._0_4_ & 0xf07) != 0x101 && uVar11 != 2) {
              return 3;
            }
            IVar18 = 0x1ba;
            if (this->_avxEnabled != false) {
              IVar18 = 0x4a9;
            }
            if ((((uVar8._0_4_ & 3) == 2) &&
                (uVar12 = Environment::stackAlignment
                                    (&((this->super_BaseEmitHelper)._emitter)->_environment),
                uVar22 < uVar12)) && (IVar18 = 0x1dd, this->_avxEnabled != false)) {
              IVar18 = 0x4c7;
            }
            uVar12 = 0x40000171;
            if (uVar22 < 0x21) {
              uVar12 = 0x20000169;
            }
            uVar6._0_4_ = 0x10000161;
            if (0x10 < uVar22) {
              uVar6._0_4_ = uVar12;
            }
            OStack_70._signature._bits = uVar6._0_4_;
            if (uVar11 != 1) goto LAB_00141920;
          }
          OStack_80._signature._bits = uVar6._0_4_;
          goto LAB_00141920;
        }
        uVar22 = (uint)bVar2;
        if (uVar11 < uVar21) {
          uVar22 = uVar20;
        }
        if ((uVar8._0_4_ & 7) != 2 && (3 < (byte)(bVar23 - 0x2d) && 9 < (byte)(bVar23 - 0x20))) {
          return 3;
        }
        IVar18 = kmovInstFromSize(uVar22);
        if (((uVar8._0_4_ & 0xf07) != 1) || (4 < uVar22)) goto LAB_00141920;
      }
      OStack_80._signature._bits = 0x4000031;
    }
LAB_00141920:
    if ((OStack_80._signature._bits & 7) == 2) {
      OStack_80._signature._bits = OStack_80._signature._bits & 0xfffffa | uVar22 << 0x18;
    }
    pBVar4 = (this->super_BaseEmitHelper)._emitter;
    pBVar4->_inlineComment = in_R9;
    EVar9 = BaseEmitter::_emitI(pBVar4,IVar18,&OStack_70,&OStack_80);
    return EVar9;
  }
  uVar6._0_4_ = (dst_->_signature)._bits;
  uVar6._4_4_ = dst_->_baseId;
  dst.super_Operand_._data = *&dst_->_data;
  uVar7._0_4_ = (src_->_signature)._bits;
  uVar7._4_4_ = src_->_baseId;
  src.super_Operand_._data = *&src_->_data;
  bVar23 = (uVar6._0_4_ & 7) == 2;
  dst.super_Operand_._0_8_ = uVar6;
  if ((bool)bVar23) {
    uVar6._0_4_ = uVar6._0_4_ & 0xfffffa | uVar7._0_4_ & 0xff000000;
    dst.super_Operand_._baseId = uVar6._4_4_;
    dst.super_Operand_._signature._bits = uVar6._0_4_;
  }
  src.super_Operand_._0_8_ = uVar7;
  if ((uVar7._0_4_ & 7) == 2) {
    bVar23 = bVar23 | 2;
    uVar7._0_4_ = uVar7._0_4_ & 0xfffffa | uVar6._0_4_ & 0xff000000;
    src.super_Operand_._baseId = uVar7._4_4_;
    src.super_Operand_._signature._bits = uVar7._0_4_;
  }
  IVar18 = 0x1b7;
  IVar19 = 0x1b7;
  switch(typeId) {
  case kInt8:
  case kUInt8:
  case kInt16:
  case kUInt16:
    if ((bVar23 & 2) != 0) {
      dst.super_Operand_._signature._bits = 0x4000031;
      IVar19 = 0x1de;
      break;
    }
    if (bVar23 != 0) break;
    uVar6._0_4_ = 0x4000031;
    dst.super_Operand_._signature._bits = 0x4000031;
    goto LAB_001414f8;
  case kInt32:
  case kUInt32:
  case kInt64:
  case _kIntEnd:
    break;
  default:
    cVar1 = TypeUtils::_typeData[typeId];
    if (bVar23 == 0 || 9 < (byte)(typeId - _kVec32Start)) {
      if (9 < (byte)(typeId - _kVec64Start) || bVar23 == 0) {
        if (cVar1 == '+') {
          bVar24 = this->_avxEnabled == false;
          IVar18 = 0x4a8;
          IVar19 = 0x1b9;
        }
        else if (cVar1 == '*') {
          bVar24 = this->_avxEnabled == false;
          IVar18 = 0x4a9;
          IVar19 = 0x1ba;
        }
        else {
          IVar19 = 0x4ad;
          if (this->_avx512Enabled != false) break;
          bVar24 = this->_avxEnabled == false;
          IVar18 = 0x4ac;
          IVar19 = 0x1c1;
        }
        if (!bVar24) {
          IVar19 = IVar18;
        }
        break;
      }
      bVar24 = (this->_avxEnabled & 1U) != 0;
      IVar19 = 0x1d6;
      if (bVar24) {
        IVar19 = 0x4c1;
      }
      IVar18 = 0x1d3;
      if (bVar24) {
        IVar18 = 0x4c0;
      }
      if (cVar1 == '+') {
        IVar18 = IVar19;
      }
      uVar22 = 0x8000000;
    }
    else {
      bVar24 = (this->_avxEnabled & 1U) != 0;
      IVar19 = 0x1d9;
      if (bVar24) {
        IVar19 = 0x4c5;
      }
      IVar18 = 0x1bc;
      if (bVar24) {
        IVar18 = 0x4aa;
      }
      if (cVar1 == '*') {
        IVar18 = IVar19;
      }
      uVar22 = 0x4000000;
    }
    if ((uVar6._0_4_ & 7) == 2) {
      dst.super_Operand_._signature._bits = uVar6._0_4_ & 0xfffffa | uVar22;
    }
    IVar19 = IVar18;
    if ((uVar7._0_4_ & 7) != 2) break;
    uVar6._0_4_ = uVar7._0_4_ & 0xfffffa | uVar22;
LAB_001414f8:
    src.super_Operand_._signature._bits = uVar6._0_4_;
    IVar19 = IVar18;
    break;
  case _kMaskStart:
    IVar19 = 0x165;
    break;
  case kMask16:
    IVar19 = 0x168;
    break;
  case kMask32:
    IVar19 = 0x166;
    break;
  case _kMaskEnd:
    IVar19 = 0x167;
    break;
  case _kMmxStart:
    IVar19 = 0x1bc;
    if (bVar23 != 0) break;
  case _kMmxEnd:
    IVar19 = 0x1d3;
  }
  pBVar4 = (this->super_BaseEmitHelper)._emitter;
  pBVar4->_inlineComment = comment;
  EVar9 = BaseEmitter::_emitI(pBVar4,IVar19,&dst.super_Operand_,&src.super_Operand_);
  return EVar9;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.as<Mem>().size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.as<Mem>().size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}